

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O2

void __thiscall PA4Application::RenderObject::loadWavefront(RenderObject *this,string *objname)

{
  pointer pSVar1;
  vector<SimpleMaterial,_std::allocator<SimpleMaterial>_> *pvVar2;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *__x;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *values;
  VAO *this_00;
  size_t sVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *values_00;
  Texture *this_01;
  size_t sVar4;
  long lVar5;
  shared_ptr<VAO> vaoSlave;
  shared_ptr<VAO> vao;
  shared_ptr<Texture> texture;
  __shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vextexPositions;
  undefined1 local_188 [64];
  Image<unsigned_char> colorMap;
  ObjLoader objLoader;
  
  ObjLoader::ObjLoader(&objLoader,objname);
  pvVar2 = ObjLoader::materials(&objLoader);
  __x = ObjLoader::vertexPositions(&objLoader);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&vextexPositions,__x);
  values = ObjLoader::vertexUVs(&objLoader);
  lVar5 = 0x48;
  this_00 = (VAO *)operator_new(0x48);
  VAO::VAO(this_00,2);
  std::__shared_ptr<VAO,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<VAO,void>
            ((__shared_ptr<VAO,(__gnu_cxx::_Lock_policy)2> *)&vao,this_00);
  VAO::setVBO<glm::vec<3,float,(glm::qualifier)0>>
            (vao.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,&vextexPositions);
  VAO::setVBO<glm::vec<2,float,(glm::qualifier)0>>
            (vao.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1,values);
  sVar3 = ObjLoader::nbIBOs(&objLoader);
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    values_00 = ObjLoader::ibo(&objLoader,(uint)sVar4);
    if ((values_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (values_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      vaoSlave.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      vaoSlave.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      VAO::makeSlaveVAO((VAO *)local_188);
      std::__shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&vaoSlave.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2> *)local_188);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8));
      VAO::setIBO<unsigned_int>
                (vaoSlave.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_ptr,values_00);
      pSVar1 = (pvVar2->super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>)._M_impl
               .super__Vector_impl_data._M_start;
      ObjLoader::image(&colorMap,&objLoader,
                       (string *)((long)&(pSVar1->name)._M_dataplus._M_p + lVar5));
      this_01 = (Texture *)operator_new(0x10);
      Texture::Texture(this_01,0xde1);
      std::__shared_ptr<Texture,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Texture,void>
                ((__shared_ptr<Texture,(__gnu_cxx::_Lock_policy)2> *)&texture,this_01);
      Texture::setData<unsigned_char>
                (texture.super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&colorMap,
                 false);
      std::__shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1d0,&vaoSlave.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1b0,(__shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2> *)this);
      std::__shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1c0,&texture.super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>);
      RenderObjectPart::RenderObjectPart
                ((RenderObjectPart *)local_188,(shared_ptr<VAO> *)&local_1d0,
                 (shared_ptr<Program> *)&local_1b0,(vec3 *)((long)pSVar1 + lVar5 + -0x1c),
                 (shared_ptr<Texture> *)&local_1c0);
      std::
      vector<PA4Application::RenderObjectPart,_std::allocator<PA4Application::RenderObjectPart>_>::
      emplace_back<PA4Application::RenderObjectPart>(&this->m_parts,(RenderObjectPart *)local_188);
      RenderObjectPart::~RenderObjectPart((RenderObjectPart *)local_188);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&texture.super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&vaoSlave.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    lVar5 = lVar5 + 0xa8;
  }
  local_188._0_4_ = 0x2601;
  Sampler::setParameter<int>
            ((this->m_colormap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>.
             _M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
             super__Head_base<0UL,_Sampler_*,_false>._M_head_impl,0x2801,(int *)local_188);
  local_188._0_4_ = 0x2600;
  Sampler::setParameter<int>
            ((this->m_colormap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>.
             _M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
             super__Head_base<0UL,_Sampler_*,_false>._M_head_impl,0x2800,(int *)local_188);
  local_188._0_4_ = 0x2901;
  Sampler::setParameter<int>
            ((this->m_colormap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>.
             _M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
             super__Head_base<0UL,_Sampler_*,_false>._M_head_impl,0x2802,(int *)local_188);
  local_188._0_4_ = 0x2901;
  Sampler::setParameter<int>
            ((this->m_colormap)._M_t.super___uniq_ptr_impl<Sampler,_std::default_delete<Sampler>_>.
             _M_t.super__Tuple_impl<0UL,_Sampler_*,_std::default_delete<Sampler>_>.
             super__Head_base<0UL,_Sampler_*,_false>._M_head_impl,0x2803,(int *)local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vao.super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&vextexPositions.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 );
  ObjLoader::~ObjLoader(&objLoader);
  return;
}

Assistant:

void PA4Application::RenderObject::loadWavefront(const std::string & objname)
{
  ObjLoader objLoader(objname);
  const std::vector<SimpleMaterial> & materials = objLoader.materials();
  std::vector<glm::vec3> vextexPositions = objLoader.vertexPositions();
  const std::vector<glm::vec2> & vertexUVs = objLoader.vertexUVs();
  // set up the VBOs of the master VAO
  std::shared_ptr<VAO> vao(new VAO(2));
  vao->setVBO(0, vextexPositions);
  vao->setVBO(1, vertexUVs);
  size_t nbParts = objLoader.nbIBOs();
  for (size_t k = 0; k < nbParts; k++) {
    const std::vector<uint> & ibo = objLoader.ibo(k);
    if (ibo.size() == 0) {
      continue;
    }
    std::shared_ptr<VAO> vaoSlave;
    vaoSlave = vao->makeSlaveVAO();
    vaoSlave->setIBO(ibo);
    const SimpleMaterial & material = materials[k];
    Image<> colorMap = objLoader.image(material.diffuseTexName);
    std::shared_ptr<Texture> texture(new Texture(GL_TEXTURE_2D));
    texture->setData(colorMap);
    m_parts.push_back(RenderObjectPart(vaoSlave, m_program, material.diffuse, texture));
  }
  m_colormap->setParameter(GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  m_colormap->setParameter(GL_TEXTURE_MAG_FILTER, GL_NEAREST);
  m_colormap->setParameter(GL_TEXTURE_WRAP_S, GL_REPEAT);
  m_colormap->setParameter(GL_TEXTURE_WRAP_T, GL_REPEAT);
}